

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::gaussian_filter(float t)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_8 = -in_XMM0_Da;
  }
  if (1.25 <= local_8) {
    local_4 = 0.0;
  }
  else {
    dVar1 = std::exp((double)(ulong)(uint)(local_8 * -2.0 * local_8));
    dVar2 = sqrt(0.6366197723675814);
    dVar2 = (double)SUB84(dVar1,0) * dVar2;
    dVar1 = blackman_exact_window(dVar2);
    local_4 = clean(dVar2 * dVar1);
  }
  return local_4;
}

Assistant:

static float gaussian_filter(float t)  // with blackman window
{
  if (t < 0)
    t = -t;
  if (t < GAUSSIAN_SUPPORT)
    return clean(exp(-2.0f * t * t) * sqrt(2.0f / M_PI) * blackman_exact_window(t / GAUSSIAN_SUPPORT));
  else
    return 0.0f;
}